

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

uint lsh::vector::distance(vector *u,vector *v)

{
  uint uVar1;
  uint uVar2;
  invalid_argument *this;
  size_type sVar3;
  const_reference pvVar4;
  uint local_30;
  uint i;
  uint n;
  uint d;
  vector *v_local;
  vector *u_local;
  
  uVar1 = size(u);
  uVar2 = size(v);
  if (uVar1 != uVar2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid vector size");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  i = 0;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&u->components_);
  for (local_30 = 0; local_30 < (uint)sVar3; local_30 = local_30 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&u->components_,(ulong)local_30);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&v->components_,(ulong)local_30);
    uVar1 = (uVar1 ^ *pvVar4) - ((uVar1 ^ *pvVar4) >> 1 & 0x55555555);
    uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
    i = ((uVar1 + (uVar1 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18) + i;
  }
  return i;
}

Assistant:

unsigned int vector::distance(const vector& u, const vector& v) {
    if (u.size() != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int d = 0;
    unsigned int n = u.components_.size();

    for (unsigned int i = 0; i < n; i++) {
      d += __builtin_popcount(u.components_[i] ^ v.components_[i]);
    }

    return d;
  }